

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceVertexIsolatedScalarQuantity::buildVertexInfoGUI
          (SurfaceVertexIsolatedScalarQuantity *this,size_t vInd)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  size_t local_10;
  
  local_10 = vInd;
  ImGui::TextUnformatted
            ((this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
             super_Quantity<polyscope::SurfaceMesh>.name._M_dataplus._M_p,(char *)0x0);
  ImGui::NextColumn();
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < local_10]) {
    if (*(ulong *)(p_Var4 + 1) >= local_10) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, local_10 < *(ulong *)(p_Var3 + 1)))
  {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    ImGui::TextUnformatted("-",(char *)0x0);
  }
  else {
    pmVar2 = std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::operator[](&this->values,&local_10);
    ImGui::Text("%g",*pmVar2);
  }
  ImGui::NextColumn();
  return;
}

Assistant:

void SurfaceVertexIsolatedScalarQuantity::buildVertexInfoGUI(size_t vInd) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();
  if (values.find(vInd) == values.end()) {
    ImGui::TextUnformatted("-");
  } else {
    ImGui::Text("%g", values[vInd]);
  }
  ImGui::NextColumn();
}